

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O0

CoverageType
tcu::calculateTriangleCoverage
          (Vec4 *p0,Vec4 *p1,Vec4 *p2,IVec2 *pixel,IVec2 *viewportSize,int subpixelBits,
          bool multisample)

{
  Vector<float,_2> *this;
  I64Vec2 *pIVar1;
  long *a;
  bool bVar2;
  int iVar3;
  int iVar4;
  deInt32 dVar5;
  deInt32 dVar6;
  ulong x_;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  long local_6b0;
  long local_6a0;
  long local_698;
  long local_688;
  float local_664;
  float local_64c;
  float local_634;
  float local_61c;
  float local_608;
  float local_5fc;
  float local_5e4;
  float local_5c4;
  float local_5ac;
  float local_58c;
  float local_574;
  float local_4ec;
  float local_49c;
  float local_47c;
  float local_464;
  float local_444;
  float local_42c;
  float local_3f0;
  float local_350 [2];
  ulong local_340;
  deInt64 crossProduct_1;
  I64Vec2 v_1;
  I64Vec2 edge_1;
  I64Vec2 *endPos_1;
  I64Vec2 *startPos_1;
  int nextEdgeNdx_1;
  int edgeNdx_1;
  int pixelEdgeEnd;
  int pixelEdgeNdx;
  I64Vec2 endPos;
  I64Vec2 startPos;
  int nextEdgeNdx;
  int endRounding;
  int startRounding;
  int edgeNdx;
  I64Vec2 *corners;
  I64Vec2 triangleSubPixelSpaceCeil [3];
  I64Vec2 triangleSubPixelSpaceFloor [3];
  I64Vec2 pixelCenterCorners [4];
  I64Vec2 pixelCorners [4];
  deInt64 crossProduct;
  I64Vec2 v;
  I64Vec2 edge;
  deInt64 maxPixelDistanceSquared;
  int local_1a0;
  int otherVtxNdx;
  int vtxNdx;
  bool insideAllEdges;
  I64Vec2 triangleSubPixelSpaceRound [3];
  Vector<long,_2> local_158;
  Vector<long,_2> local_148;
  tcu local_138 [16];
  undefined1 local_128 [8];
  I64Vec2 pixelCenterPosition;
  float maxY;
  float maxX;
  float minY;
  float minX;
  Vector<float,_2> local_100;
  Vector<float,_2> local_f8;
  Vector<float,_2> local_f0;
  Vector<float,_2> local_e8;
  Vector<float,_2> local_e0;
  Vector<float,_2> local_d8;
  Vector<float,_2> local_d0;
  Vector<float,_2> local_c8;
  Vector<float,_2> local_c0;
  Vector<float,_2> local_b8;
  Vector<float,_2> local_b0;
  Vector<float,_2> local_a8;
  Vec2 triangleScreenSpace [3];
  Vector<float,_2> local_88;
  Vec2 triangleNormalizedDeviceSpace [3];
  Vec4 *orderedP2;
  Vec4 *orderedP1;
  Vec4 *orderedP0;
  bool order;
  deUint64 pixelHitBoxSize;
  deUint64 numSubPixels;
  bool multisample_local;
  int subpixelBits_local;
  IVec2 *viewportSize_local;
  IVec2 *pixel_local;
  Vec4 *p2_local;
  Vec4 *p1_local;
  Vec4 *p0_local;
  
  x_ = 1L << ((byte)subpixelBits & 0x3f);
  local_340 = x_;
  if (!multisample) {
    local_340 = 4;
  }
  bVar2 = anon_unknown_3::isTriangleClockwise(p0,p1,p2);
  local_350 = (float  [2])p1;
  if (bVar2) {
    local_350 = (float  [2])p2;
    p2 = p1;
  }
  triangleNormalizedDeviceSpace[2].m_data[0] = local_350[0];
  triangleNormalizedDeviceSpace[2].m_data[1] = local_350[1];
  fVar11 = Vector<float,_4>::x(p0);
  fVar12 = Vector<float,_4>::w(p0);
  fVar13 = Vector<float,_4>::y(p0);
  fVar14 = Vector<float,_4>::w(p0);
  Vector<float,_2>::Vector(&local_88,fVar11 / fVar12,fVar13 / fVar14);
  fVar11 = Vector<float,_4>::x(p2);
  fVar12 = Vector<float,_4>::w(p2);
  fVar13 = Vector<float,_4>::y(p2);
  fVar14 = Vector<float,_4>::w(p2);
  Vector<float,_2>::Vector(triangleNormalizedDeviceSpace,fVar11 / fVar12,fVar13 / fVar14);
  fVar11 = Vector<float,_4>::x((Vector<float,_4> *)triangleNormalizedDeviceSpace[2].m_data);
  fVar12 = Vector<float,_4>::w((Vector<float,_4> *)triangleNormalizedDeviceSpace[2].m_data);
  fVar13 = Vector<float,_4>::y((Vector<float,_4> *)triangleNormalizedDeviceSpace[2].m_data);
  fVar14 = Vector<float,_4>::w((Vector<float,_4> *)triangleNormalizedDeviceSpace[2].m_data);
  Vector<float,_2>::Vector(triangleNormalizedDeviceSpace + 1,fVar11 / fVar12,fVar13 / fVar14);
  Vector<float,_2>::Vector(&local_c0,1.0,1.0);
  operator+((tcu *)&local_b8,&local_88,&local_c0);
  operator*((tcu *)&local_b0,&local_b8,0.5);
  iVar3 = Vector<int,_2>::x(viewportSize);
  iVar4 = Vector<int,_2>::y(viewportSize);
  Vector<float,_2>::Vector(&local_c8,(float)iVar3,(float)iVar4);
  operator*((tcu *)&local_a8,&local_b0,&local_c8);
  Vector<float,_2>::Vector(&local_e0,1.0,1.0);
  operator+((tcu *)&local_d8,triangleNormalizedDeviceSpace,&local_e0);
  operator*((tcu *)&local_d0,&local_d8,0.5);
  iVar3 = Vector<int,_2>::x(viewportSize);
  iVar4 = Vector<int,_2>::y(viewportSize);
  Vector<float,_2>::Vector(&local_e8,(float)iVar3,(float)iVar4);
  operator*((tcu *)triangleScreenSpace,&local_d0,&local_e8);
  Vector<float,_2>::Vector(&local_100,1.0,1.0);
  operator+((tcu *)&local_f8,triangleNormalizedDeviceSpace + 1,&local_100);
  operator*((tcu *)&local_f0,&local_f8,0.5);
  iVar3 = Vector<int,_2>::x(viewportSize);
  iVar4 = Vector<int,_2>::y(viewportSize);
  Vector<float,_2>::Vector((Vector<float,_2> *)&minY,(float)iVar3,(float)iVar4);
  operator*((tcu *)(triangleScreenSpace + 1),&local_f0,(Vector<float,_2> *)&minY);
  fVar11 = Vector<float,_2>::x(&local_a8);
  fVar12 = Vector<float,_2>::x(triangleScreenSpace);
  fVar11 = de::min<float>(fVar11,fVar12);
  fVar12 = Vector<float,_2>::x(triangleScreenSpace + 1);
  fVar11 = de::min<float>(fVar11,fVar12);
  fVar12 = Vector<float,_2>::y(&local_a8);
  fVar13 = Vector<float,_2>::y(triangleScreenSpace);
  fVar12 = de::min<float>(fVar12,fVar13);
  fVar13 = Vector<float,_2>::y(triangleScreenSpace + 1);
  fVar12 = de::min<float>(fVar12,fVar13);
  fVar13 = Vector<float,_2>::x(&local_a8);
  fVar14 = Vector<float,_2>::x(triangleScreenSpace);
  fVar13 = de::max<float>(fVar13,fVar14);
  fVar14 = Vector<float,_2>::x(triangleScreenSpace + 1);
  pixelCenterPosition.m_data[1]._4_4_ = de::max<float>(fVar13,fVar14);
  fVar13 = Vector<float,_2>::y(&local_a8);
  fVar14 = Vector<float,_2>::y(triangleScreenSpace);
  fVar13 = de::max<float>(fVar13,fVar14);
  fVar14 = Vector<float,_2>::y(triangleScreenSpace + 1);
  pixelCenterPosition.m_data[1]._0_4_ = de::max<float>(fVar13,fVar14);
  iVar3 = Vector<int,_2>::x(pixel);
  if ((((pixelCenterPosition.m_data[1]._4_4_ + 1.0 < (float)iVar3) ||
       (iVar3 = Vector<int,_2>::y(pixel), (float)pixelCenterPosition.m_data[1] + 1.0 < (float)iVar3)
       ) || (iVar3 = Vector<int,_2>::x(pixel), (float)iVar3 < fVar11 - 1.0)) ||
     (iVar3 = Vector<int,_2>::y(pixel), (float)iVar3 < fVar12 - 1.0)) {
    p0_local._4_4_ = COVERAGE_NONE;
  }
  else {
    iVar3 = Vector<int,_2>::x(pixel);
    iVar4 = Vector<int,_2>::y(pixel);
    Vector<long,_2>::Vector(&local_148,(long)iVar3,(long)iVar4);
    Vector<long,_2>::Vector(&local_158,x_,x_);
    operator*(local_138,&local_148,&local_158);
    Vector<long,_2>::Vector
              ((Vector<long,_2> *)(triangleSubPixelSpaceRound[2].m_data + 1),x_ >> 1,x_ >> 1);
    operator+((tcu *)local_128,(Vector<long,_2> *)local_138,
              (Vector<long,_2> *)(triangleSubPixelSpaceRound[2].m_data + 1));
    fVar11 = Vector<float,_2>::x(&local_a8);
    local_3f0 = (float)x_;
    dVar5 = deRoundFloatToInt32(fVar11 * local_3f0);
    fVar11 = Vector<float,_2>::y(&local_a8);
    local_42c = (float)x_;
    dVar6 = deRoundFloatToInt32(fVar11 * local_42c);
    Vector<long,_2>::Vector((Vector<long,_2> *)&vtxNdx,(long)dVar5,(long)dVar6);
    fVar11 = Vector<float,_2>::x(triangleScreenSpace);
    local_444 = (float)x_;
    dVar5 = deRoundFloatToInt32(fVar11 * local_444);
    fVar11 = Vector<float,_2>::y(triangleScreenSpace);
    local_464 = (float)x_;
    dVar6 = deRoundFloatToInt32(fVar11 * local_464);
    Vector<long,_2>::Vector
              ((Vector<long,_2> *)(triangleSubPixelSpaceRound[0].m_data + 1),(long)dVar5,(long)dVar6
              );
    fVar11 = Vector<float,_2>::x(triangleScreenSpace + 1);
    local_47c = (float)x_;
    dVar5 = deRoundFloatToInt32(fVar11 * local_47c);
    fVar11 = Vector<float,_2>::y(triangleScreenSpace + 1);
    local_49c = (float)x_;
    dVar6 = deRoundFloatToInt32(fVar11 * local_49c);
    Vector<long,_2>::Vector
              ((Vector<long,_2> *)(triangleSubPixelSpaceRound[1].m_data + 1),(long)dVar5,(long)dVar6
              );
    bVar2 = true;
    for (local_1a0 = 0; local_1a0 < 3; local_1a0 = local_1a0 + 1) {
      operator-((tcu *)(v.m_data + 1),(Vector<long,_2> *)(&vtxNdx + (long)((local_1a0 + 1) % 3) * 4)
                ,(Vector<long,_2> *)(&vtxNdx + (long)local_1a0 * 4));
      operator-((tcu *)&crossProduct,(Vector<long,_2> *)local_128,
                (Vector<long,_2> *)(&vtxNdx + (long)local_1a0 * 4));
      lVar7 = Vector<long,_2>::x((Vector<long,_2> *)(v.m_data + 1));
      lVar8 = Vector<long,_2>::y((Vector<long,_2> *)&crossProduct);
      lVar9 = Vector<long,_2>::y((Vector<long,_2> *)(v.m_data + 1));
      lVar10 = Vector<long,_2>::x((Vector<long,_2> *)&crossProduct);
      pixelCorners[3].m_data[1] = lVar7 * lVar8 - lVar9 * lVar10;
      if ((pixelCorners[3].m_data[1] < 0) &&
         (lVar7 = pixelCorners[3].m_data[1] * pixelCorners[3].m_data[1],
         lVar8 = lengthSquared<long,2>((Vector<long,_2> *)(v.m_data + 1)),
         (long)(local_340 * local_340 * lVar8) < lVar7)) {
        return COVERAGE_NONE;
      }
      if ((pixelCorners[3].m_data[1] < 0) ||
         (lVar7 = pixelCorners[3].m_data[1] * pixelCorners[3].m_data[1],
         lVar8 = lengthSquared<long,2>((Vector<long,_2> *)(v.m_data + 1)),
         lVar7 < (long)(local_340 * local_340 * lVar8))) {
        bVar2 = false;
      }
    }
    if (bVar2) {
      p0_local._4_4_ = COVERAGE_FULL;
    }
    else {
      iVar3 = Vector<int,_2>::x(pixel);
      iVar4 = Vector<int,_2>::y(pixel);
      Vector<long,_2>::Vector
                ((Vector<long,_2> *)(pixelCenterCorners[3].m_data + 1),(long)iVar3 * x_,
                 (long)iVar4 * x_);
      iVar3 = Vector<int,_2>::x(pixel);
      iVar4 = Vector<int,_2>::y(pixel);
      Vector<long,_2>::Vector
                ((Vector<long,_2> *)(pixelCorners[0].m_data + 1),(long)(iVar3 + 1) * x_,
                 (long)iVar4 * x_);
      iVar3 = Vector<int,_2>::x(pixel);
      iVar4 = Vector<int,_2>::y(pixel);
      Vector<long,_2>::Vector
                ((Vector<long,_2> *)(pixelCorners[1].m_data + 1),(long)(iVar3 + 1) * x_,
                 (long)(iVar4 + 1) * x_);
      iVar3 = Vector<int,_2>::x(pixel);
      iVar4 = Vector<int,_2>::y(pixel);
      Vector<long,_2>::Vector
                ((Vector<long,_2> *)(pixelCorners[2].m_data + 1),(long)iVar3 * x_,
                 (long)(iVar4 + 1) * x_);
      iVar3 = Vector<int,_2>::x(pixel);
      iVar4 = Vector<int,_2>::y(pixel);
      Vector<long,_2>::Vector
                ((Vector<long,_2> *)(triangleSubPixelSpaceFloor[2].m_data + 1),
                 (long)iVar3 * x_ + (x_ >> 1),(long)iVar4 * x_ + (x_ >> 1));
      iVar3 = Vector<int,_2>::x(pixel);
      iVar4 = Vector<int,_2>::y(pixel);
      Vector<long,_2>::Vector
                ((Vector<long,_2> *)(pixelCenterCorners[0].m_data + 1),
                 (long)iVar3 * x_ + 1 + (x_ >> 1),(long)iVar4 * x_ + (x_ >> 1));
      iVar3 = Vector<int,_2>::x(pixel);
      iVar4 = Vector<int,_2>::y(pixel);
      Vector<long,_2>::Vector
                ((Vector<long,_2> *)(pixelCenterCorners[1].m_data + 1),
                 (long)iVar3 * x_ + 1 + (x_ >> 1),(long)iVar4 * x_ + 1 + (x_ >> 1));
      iVar3 = Vector<int,_2>::x(pixel);
      iVar4 = Vector<int,_2>::y(pixel);
      Vector<long,_2>::Vector
                ((Vector<long,_2> *)(pixelCenterCorners[2].m_data + 1),(long)iVar3 * x_ + (x_ >> 1),
                 (long)iVar4 * x_ + 1 + (x_ >> 1));
      fVar11 = Vector<float,_2>::x(&local_a8);
      local_4ec = (float)x_;
      dVar5 = deFloorFloatToInt32(fVar11 * local_4ec);
      fVar11 = Vector<float,_2>::y(&local_a8);
      local_574 = (float)x_;
      dVar6 = deFloorFloatToInt32(fVar11 * local_574);
      Vector<long,_2>::Vector
                ((Vector<long,_2> *)(triangleSubPixelSpaceCeil[2].m_data + 1),(long)dVar5,
                 (long)dVar6);
      fVar11 = Vector<float,_2>::x(triangleScreenSpace);
      local_58c = (float)x_;
      dVar5 = deFloorFloatToInt32(fVar11 * local_58c);
      fVar11 = Vector<float,_2>::y(triangleScreenSpace);
      local_5ac = (float)x_;
      dVar6 = deFloorFloatToInt32(fVar11 * local_5ac);
      Vector<long,_2>::Vector
                ((Vector<long,_2> *)(triangleSubPixelSpaceFloor[0].m_data + 1),(long)dVar5,
                 (long)dVar6);
      this = triangleScreenSpace + 1;
      fVar11 = Vector<float,_2>::x(this);
      local_5c4 = (float)x_;
      dVar5 = deFloorFloatToInt32(fVar11 * local_5c4);
      fVar11 = Vector<float,_2>::y(this);
      local_5e4 = (float)x_;
      dVar6 = deFloorFloatToInt32(fVar11 * local_5e4);
      Vector<long,_2>::Vector
                ((Vector<long,_2> *)(triangleSubPixelSpaceFloor[1].m_data + 1),(long)dVar5,
                 (long)dVar6);
      fVar11 = Vector<float,_2>::x(&local_a8);
      local_5fc = (float)x_;
      dVar5 = deCeilFloatToInt32(fVar11 * local_5fc);
      fVar11 = Vector<float,_2>::y(&local_a8);
      local_608 = (float)x_;
      dVar6 = deCeilFloatToInt32(fVar11 * local_608);
      Vector<long,_2>::Vector((Vector<long,_2> *)&corners,(long)dVar5,(long)dVar6);
      fVar11 = Vector<float,_2>::x(triangleScreenSpace);
      local_61c = (float)x_;
      dVar5 = deCeilFloatToInt32(fVar11 * local_61c);
      fVar11 = Vector<float,_2>::y(triangleScreenSpace);
      local_634 = (float)x_;
      dVar6 = deCeilFloatToInt32(fVar11 * local_634);
      Vector<long,_2>::Vector
                ((Vector<long,_2> *)(triangleSubPixelSpaceCeil[0].m_data + 1),(long)dVar5,
                 (long)dVar6);
      fVar11 = Vector<float,_2>::x(this);
      local_64c = (float)x_;
      dVar5 = deCeilFloatToInt32(fVar11 * local_64c);
      fVar11 = Vector<float,_2>::y(this);
      local_664 = (float)x_;
      dVar6 = deCeilFloatToInt32(fVar11 * local_664);
      Vector<long,_2>::Vector
                ((Vector<long,_2> *)(triangleSubPixelSpaceCeil[1].m_data + 1),(long)dVar5,
                 (long)dVar6);
      if (multisample) {
        pIVar1 = pixelCenterCorners + 3;
      }
      else {
        pIVar1 = triangleSubPixelSpaceFloor + 2;
      }
      a = pIVar1->m_data + 1;
      for (endRounding = 0; endRounding < 3; endRounding = endRounding + 1) {
        for (nextEdgeNdx = 0; nextEdgeNdx < 4; nextEdgeNdx = nextEdgeNdx + 1) {
          for (startPos.m_data[1]._4_4_ = 0; (int)startPos.m_data[1]._4_4_ < 4;
              startPos.m_data[1]._4_4_ = startPos.m_data[1]._4_4_ + 1) {
            iVar3 = (endRounding + 1) % 3;
            if ((nextEdgeNdx & 1U) == 0) {
              local_688 = Vector<long,_2>::x((Vector<long,_2> *)
                                             (triangleSubPixelSpaceCeil[(long)endRounding + -1].
                                              m_data + 1));
            }
            else {
              local_688 = Vector<long,_2>::x((Vector<long,_2> *)
                                             (triangleSubPixelSpaceCeil[(long)endRounding + 2].
                                              m_data + 1));
            }
            if ((nextEdgeNdx & 2U) == 0) {
              local_698 = Vector<long,_2>::y((Vector<long,_2> *)
                                             (triangleSubPixelSpaceCeil[(long)endRounding + -1].
                                              m_data + 1));
            }
            else {
              local_698 = Vector<long,_2>::y((Vector<long,_2> *)
                                             (triangleSubPixelSpaceCeil[(long)endRounding + 2].
                                              m_data + 1));
            }
            Vector<long,_2>::Vector((Vector<long,_2> *)(endPos.m_data + 1),local_688,local_698);
            if ((startPos.m_data[1]._4_4_ & 1) == 0) {
              local_6a0 = Vector<long,_2>::x((Vector<long,_2> *)
                                             (triangleSubPixelSpaceCeil[(long)iVar3 + -1].m_data + 1
                                             ));
            }
            else {
              local_6a0 = Vector<long,_2>::x((Vector<long,_2> *)
                                             (triangleSubPixelSpaceCeil[(long)iVar3 + 2].m_data + 1)
                                            );
            }
            if ((startPos.m_data[1]._4_4_ & 2) == 0) {
              local_6b0 = Vector<long,_2>::y((Vector<long,_2> *)
                                             (triangleSubPixelSpaceCeil[(long)iVar3 + -1].m_data + 1
                                             ));
            }
            else {
              local_6b0 = Vector<long,_2>::y((Vector<long,_2> *)
                                             (triangleSubPixelSpaceCeil[(long)iVar3 + 2].m_data + 1)
                                            );
            }
            Vector<long,_2>::Vector((Vector<long,_2> *)&pixelEdgeEnd,local_6a0,local_6b0);
            for (edgeNdx_1 = 0; edgeNdx_1 < 4; edgeNdx_1 = edgeNdx_1 + 1) {
              bVar2 = anon_unknown_3::lineLineIntersect
                                ((Vector<long,_2> *)(endPos.m_data + 1),
                                 (Vector<long,_2> *)&pixelEdgeEnd,
                                 (Vector<long,_2> *)(a + (long)edgeNdx_1 * 2),
                                 (Vector<long,_2> *)(a + (long)((edgeNdx_1 + 1) % 4) * 2));
              if (bVar2) {
                return COVERAGE_PARTIAL;
              }
            }
          }
        }
      }
      for (startPos_1._4_4_ = 0; startPos_1._4_4_ < 3; startPos_1._4_4_ = startPos_1._4_4_ + 1) {
        operator-((tcu *)(v_1.m_data + 1),
                  (Vector<long,_2> *)
                  (triangleSubPixelSpaceCeil[(long)((startPos_1._4_4_ + 1) % 3) + 2].m_data + 1),
                  (Vector<long,_2> *)
                  (triangleSubPixelSpaceCeil[(long)startPos_1._4_4_ + 2].m_data + 1));
        operator-((tcu *)&crossProduct_1,(Vector<long,_2> *)a,
                  (Vector<long,_2> *)
                  (triangleSubPixelSpaceCeil[(long)((startPos_1._4_4_ + 1) % 3) + 2].m_data + 1));
        lVar7 = Vector<long,_2>::x((Vector<long,_2> *)(v_1.m_data + 1));
        lVar8 = Vector<long,_2>::y((Vector<long,_2> *)&crossProduct_1);
        lVar9 = Vector<long,_2>::y((Vector<long,_2> *)(v_1.m_data + 1));
        lVar10 = Vector<long,_2>::x((Vector<long,_2> *)&crossProduct_1);
        if (lVar7 * lVar8 - lVar9 * lVar10 < 0) {
          return COVERAGE_NONE;
        }
      }
      p0_local._4_4_ = COVERAGE_FULL;
    }
  }
  return p0_local._4_4_;
}

Assistant:

CoverageType calculateTriangleCoverage (const tcu::Vec4& p0, const tcu::Vec4& p1, const tcu::Vec4& p2, const tcu::IVec2& pixel, const tcu::IVec2& viewportSize, int subpixelBits, bool multisample)
{
	typedef tcu::Vector<deInt64, 2> I64Vec2;

	const deUint64		numSubPixels						= ((deUint64)1) << subpixelBits;
	const deUint64		pixelHitBoxSize						= (multisample) ? (numSubPixels) : (2+2);	//!< allow 4 central (2x2) for non-multisample pixels. Rounding may move edges 1 subpixel to any direction.
	const bool			order								= isTriangleClockwise(p0, p1, p2);			//!< clockwise / counter-clockwise
	const tcu::Vec4&	orderedP0							= p0;										//!< vertices of a clockwise triangle
	const tcu::Vec4&	orderedP1							= (order) ? (p1) : (p2);
	const tcu::Vec4&	orderedP2							= (order) ? (p2) : (p1);
	const tcu::Vec2		triangleNormalizedDeviceSpace[3]	=
	{
		tcu::Vec2(orderedP0.x() / orderedP0.w(), orderedP0.y() / orderedP0.w()),
		tcu::Vec2(orderedP1.x() / orderedP1.w(), orderedP1.y() / orderedP1.w()),
		tcu::Vec2(orderedP2.x() / orderedP2.w(), orderedP2.y() / orderedP2.w()),
	};
	const tcu::Vec2		triangleScreenSpace[3]				=
	{
		(triangleNormalizedDeviceSpace[0] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * tcu::Vec2((float)viewportSize.x(), (float)viewportSize.y()),
		(triangleNormalizedDeviceSpace[1] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * tcu::Vec2((float)viewportSize.x(), (float)viewportSize.y()),
		(triangleNormalizedDeviceSpace[2] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * tcu::Vec2((float)viewportSize.x(), (float)viewportSize.y()),
	};

	// Broad bounding box - pixel check
	{
		const float minX = de::min(de::min(triangleScreenSpace[0].x(), triangleScreenSpace[1].x()), triangleScreenSpace[2].x());
		const float minY = de::min(de::min(triangleScreenSpace[0].y(), triangleScreenSpace[1].y()), triangleScreenSpace[2].y());
		const float maxX = de::max(de::max(triangleScreenSpace[0].x(), triangleScreenSpace[1].x()), triangleScreenSpace[2].x());
		const float maxY = de::max(de::max(triangleScreenSpace[0].y(), triangleScreenSpace[1].y()), triangleScreenSpace[2].y());

		if ((float)pixel.x() > maxX + 1 ||
			(float)pixel.y() > maxY + 1 ||
			(float)pixel.x() < minX - 1 ||
			(float)pixel.y() < minY - 1)
			return COVERAGE_NONE;
	}

	// Broad triangle - pixel area intersection
	{
		const I64Vec2 pixelCenterPosition = I64Vec2(pixel.x(), pixel.y()) * I64Vec2(numSubPixels, numSubPixels) + I64Vec2(numSubPixels / 2, numSubPixels / 2);
		const I64Vec2 triangleSubPixelSpaceRound[3] =
		{
			I64Vec2(deRoundFloatToInt32(triangleScreenSpace[0].x() * (float)numSubPixels), deRoundFloatToInt32(triangleScreenSpace[0].y() * (float)numSubPixels)),
			I64Vec2(deRoundFloatToInt32(triangleScreenSpace[1].x() * (float)numSubPixels), deRoundFloatToInt32(triangleScreenSpace[1].y() * (float)numSubPixels)),
			I64Vec2(deRoundFloatToInt32(triangleScreenSpace[2].x() * (float)numSubPixels), deRoundFloatToInt32(triangleScreenSpace[2].y() * (float)numSubPixels)),
		};

		// Check (using cross product) if pixel center is
		// a) too far from any edge
		// b) fully inside all edges
		bool insideAllEdges = true;
		for (int vtxNdx = 0; vtxNdx < 3; ++vtxNdx)
		{
			const int		otherVtxNdx				= (vtxNdx + 1) % 3;
			const deInt64	maxPixelDistanceSquared	= pixelHitBoxSize*pixelHitBoxSize; // Max distance from the pixel center from within the pixel is (sqrt(2) * boxWidth/2). Use 2x value for rounding tolerance
			const I64Vec2	edge					= triangleSubPixelSpaceRound[otherVtxNdx]	- triangleSubPixelSpaceRound[vtxNdx];
			const I64Vec2	v						= pixelCenterPosition						- triangleSubPixelSpaceRound[vtxNdx];
			const deInt64	crossProduct			= (edge.x() * v.y() - edge.y() * v.x());

			// distance from edge: (edge x v) / |edge|
			//     (edge x v) / |edge| > maxPixelDistance
			// ==> (edge x v)^2 / edge^2 > maxPixelDistance^2    | edge x v > 0
			// ==> (edge x v)^2 > maxPixelDistance^2 * edge^2
			if (crossProduct < 0 && crossProduct*crossProduct > maxPixelDistanceSquared * tcu::lengthSquared(edge))
				return COVERAGE_NONE;
			if (crossProduct < 0 || crossProduct*crossProduct < maxPixelDistanceSquared * tcu::lengthSquared(edge))
				insideAllEdges = false;
		}

		if (insideAllEdges)
			return COVERAGE_FULL;
	}

	// Accurate intersection for edge pixels
	{
		//  In multisampling, the sample points can be anywhere in the pixel, and in single sampling only in the center.
		const I64Vec2 pixelCorners[4] =
		{
			I64Vec2((pixel.x()+0) * numSubPixels, (pixel.y()+0) * numSubPixels),
			I64Vec2((pixel.x()+1) * numSubPixels, (pixel.y()+0) * numSubPixels),
			I64Vec2((pixel.x()+1) * numSubPixels, (pixel.y()+1) * numSubPixels),
			I64Vec2((pixel.x()+0) * numSubPixels, (pixel.y()+1) * numSubPixels),
		};
		const I64Vec2 pixelCenterCorners[4] =
		{
			I64Vec2(pixel.x() * numSubPixels + numSubPixels/2 + 0, pixel.y() * numSubPixels + numSubPixels/2 + 0),
			I64Vec2(pixel.x() * numSubPixels + numSubPixels/2 + 1, pixel.y() * numSubPixels + numSubPixels/2 + 0),
			I64Vec2(pixel.x() * numSubPixels + numSubPixels/2 + 1, pixel.y() * numSubPixels + numSubPixels/2 + 1),
			I64Vec2(pixel.x() * numSubPixels + numSubPixels/2 + 0, pixel.y() * numSubPixels + numSubPixels/2 + 1),
		};

		// both rounding directions
		const I64Vec2 triangleSubPixelSpaceFloor[3] =
		{
			I64Vec2(deFloorFloatToInt32(triangleScreenSpace[0].x() * (float)numSubPixels), deFloorFloatToInt32(triangleScreenSpace[0].y() * (float)numSubPixels)),
			I64Vec2(deFloorFloatToInt32(triangleScreenSpace[1].x() * (float)numSubPixels), deFloorFloatToInt32(triangleScreenSpace[1].y() * (float)numSubPixels)),
			I64Vec2(deFloorFloatToInt32(triangleScreenSpace[2].x() * (float)numSubPixels), deFloorFloatToInt32(triangleScreenSpace[2].y() * (float)numSubPixels)),
		};
		const I64Vec2 triangleSubPixelSpaceCeil[3] =
		{
			I64Vec2(deCeilFloatToInt32(triangleScreenSpace[0].x() * (float)numSubPixels), deCeilFloatToInt32(triangleScreenSpace[0].y() * (float)numSubPixels)),
			I64Vec2(deCeilFloatToInt32(triangleScreenSpace[1].x() * (float)numSubPixels), deCeilFloatToInt32(triangleScreenSpace[1].y() * (float)numSubPixels)),
			I64Vec2(deCeilFloatToInt32(triangleScreenSpace[2].x() * (float)numSubPixels), deCeilFloatToInt32(triangleScreenSpace[2].y() * (float)numSubPixels)),
		};
		const I64Vec2* const corners = (multisample) ? (pixelCorners) : (pixelCenterCorners);

		// Test if any edge (with any rounding) intersects the pixel (boundary). If it does => Partial. If not => fully inside or outside

		for (int edgeNdx = 0; edgeNdx < 3; ++edgeNdx)
		for (int startRounding = 0; startRounding < 4; ++startRounding)
		for (int endRounding = 0; endRounding < 4; ++endRounding)
		{
			const int		nextEdgeNdx	= (edgeNdx+1) % 3;
			const I64Vec2	startPos	((startRounding&0x01)	? (triangleSubPixelSpaceFloor[edgeNdx].x())		: (triangleSubPixelSpaceCeil[edgeNdx].x()),		(startRounding&0x02)	? (triangleSubPixelSpaceFloor[edgeNdx].y())		: (triangleSubPixelSpaceCeil[edgeNdx].y()));
			const I64Vec2	endPos		((endRounding&0x01)		? (triangleSubPixelSpaceFloor[nextEdgeNdx].x())	: (triangleSubPixelSpaceCeil[nextEdgeNdx].x()),	(endRounding&0x02)		? (triangleSubPixelSpaceFloor[nextEdgeNdx].y())	: (triangleSubPixelSpaceCeil[nextEdgeNdx].y()));

			for (int pixelEdgeNdx = 0; pixelEdgeNdx < 4; ++pixelEdgeNdx)
			{
				const int pixelEdgeEnd = (pixelEdgeNdx + 1) % 4;

				if (lineLineIntersect(startPos, endPos, corners[pixelEdgeNdx], corners[pixelEdgeEnd]))
					return COVERAGE_PARTIAL;
			}
		}

		// fully inside or outside
		for (int edgeNdx = 0; edgeNdx < 3; ++edgeNdx)
		{
			const int		nextEdgeNdx		= (edgeNdx+1) % 3;
			const I64Vec2&	startPos		= triangleSubPixelSpaceFloor[edgeNdx];
			const I64Vec2&	endPos			= triangleSubPixelSpaceFloor[nextEdgeNdx];
			const I64Vec2	edge			= endPos - startPos;
			const I64Vec2	v				= corners[0] - endPos;
			const deInt64	crossProduct	= (edge.x() * v.y() - edge.y() * v.x());

			// a corner of the pixel is outside => "fully inside" option is impossible
			if (crossProduct < 0)
				return COVERAGE_NONE;
		}

		return COVERAGE_FULL;
	}
}